

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<4UL> * __thiscall GF2::ZZ<4UL>::operator-=(ZZ<4UL> *this,word wRight)

{
  ulong uVar1;
  word wVar2;
  long in_RSI;
  WW<4UL> *in_RDI;
  bool bVar3;
  size_t pos;
  long local_18;
  
  uVar1 = in_RDI->_words[0] - in_RSI;
  in_RDI->_words[0] = uVar1;
  if (-in_RSI - 1U < uVar1) {
    local_18 = 1;
    while( true ) {
      bVar3 = false;
      if (local_18 == 0) {
        wVar2 = in_RDI->_words[0] - 1;
        in_RDI->_words[0] = wVar2;
        bVar3 = wVar2 == 0xffffffffffffffff;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
  }
  WW<4UL>::Trim(in_RDI);
  return (ZZ<4UL> *)in_RDI;
}

Assistant:

ZZ& operator-=(word wRight)
	{	
 		if ((_words[0] -= wRight) > WORD_MAX - wRight)
		{
			size_t pos = 1;
			for (; pos < _wcount && --_words[pos] == WORD_MAX; ++pos);
		}
		Trim();
		return *this;
	}